

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.cc
# Opt level: O2

int __thiscall sentencepiece::PieceToByte(sentencepiece *this,string_view piece)

{
  PieceToByteMap *this_00;
  uint uVar1;
  int iVar2;
  const_iterator cVar3;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  mapped_type *pmVar4;
  uchar in_stack_ffffffffffffffaf;
  allocator<char> local_49;
  string_view piece_local;
  key_type local_38;
  
  piece_local._M_str = (char *)piece._M_len;
  piece_local._M_len = (size_t)this;
  if (PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::kMap_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::
                                 kMap_abi_cxx11_,piece_local._M_str,piece._M_str);
    if (iVar2 != 0) {
      this_01 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)operator_new(0x38);
      *(undefined8 *)(this_01 + 0x20) = 0;
      *(undefined8 *)(this_01 + 0x28) = 0;
      *(_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        **)this_01 = this_01 + 0x30;
      *(undefined8 *)(this_01 + 8) = 1;
      *(undefined8 *)(this_01 + 0x10) = 0;
      *(undefined8 *)(this_01 + 0x18) = 0;
      *(undefined4 *)(this_01 + 0x20) = 0x3f800000;
      *(undefined8 *)(this_01 + 0x28) = 0;
      *(undefined8 *)(this_01 + 0x30) = 0;
      for (iVar2 = 0; iVar2 != 0x100; iVar2 = iVar2 + 1) {
        ByteToPiece_abi_cxx11_(in_stack_ffffffffffffffaf);
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](this_01,&local_38);
        *pmVar4 = (mapped_type)iVar2;
        std::__cxx11::string::~string((string *)&local_38);
      }
      PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::kMap_abi_cxx11_ =
           (PieceToByteMap *)this_01;
      __cxa_guard_release(&PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::
                           kMap_abi_cxx11_);
    }
  }
  this_00 = PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::kMap_abi_cxx11_;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_38,&piece_local,&local_49);
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = (uint)*(byte *)((long)cVar3.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
                                  ._M_cur + 0x28);
  }
  return uVar1;
}

Assistant:

int PieceToByte(absl::string_view piece) {
  using PieceToByteMap = absl::flat_hash_map<std::string, unsigned char>;
  static const auto *const kMap = []() -> PieceToByteMap * {
    auto *m = new PieceToByteMap();
    for (int i = 0; i < 256; ++i) {
      (*m)[ByteToPiece(i)] = i;
    }
    return m;
  }();
  const auto it = kMap->find(std::string(piece));
  if (it == kMap->end()) {
    return -1;
  } else {
    return it->second;
  }
}